

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase458::run(TestCase458 *this)

{
  TestEnum_9c8e9318b29d9cd3 TVar1;
  TestEnum_9c8e9318b29d9cd3 TVar2;
  Reader *this_00;
  TestEnum_9c8e9318b29d9cd3 *pTVar3;
  uint i;
  long lVar4;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  initializer_list<capnp::DynamicValue::Reader> value;
  Fault f_1;
  TestEnum_9c8e9318b29d9cd3 local_26c [2];
  unsigned_long local_268;
  ListElementCount local_25c;
  BuilderFor<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>_> typed;
  Reader local_210;
  Builder root;
  BuilderFor<capnp::DynamicList> list;
  Builder local_160;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root,&builder.super_MessageBuilder,(StructSchema)0x662308);
  typed.builder.segment._0_4_ = 9;
  typed.builder.capTable = (CapTableBuilder *)(schemas::s_9c8e9318b29d9cd3 + 0x48);
  typed.builder.ptr._0_2_ = 2;
  name_02.content.size_ = 10;
  name_02.content.ptr = "enumField";
  DynamicStruct::Builder::set(&root,name_02,(Reader *)&typed);
  DynamicValue::Reader::~Reader((Reader *)&typed);
  typed.builder.segment._0_4_ = ENUM;
  typed.builder.capTable = (CapTableBuilder *)(schemas::s_9c8e9318b29d9cd3 + 0x48);
  typed.builder.ptr._0_2_ = 1;
  local_210.field_1.floatValue = 3.30703037670097e-317;
  local_210.field_1.enumValue.value = 0;
  name_03.content.size_ = 9;
  name_03.content.ptr = "enumList";
  value._M_len = 2;
  value._M_array = (iterator)&typed;
  local_210.type = (Type)typed.builder.segment;
  DynamicStruct::Builder::set(&root,name_03,value);
  this_00 = &local_210;
  lVar4 = 0;
  do {
    DynamicValue::Reader::~Reader(this_00);
    lVar4 = lVar4 + 0x48;
    this_00 = this_00 + -1;
  } while (lVar4 != 0x90);
  name.content.size_ = 10;
  name.content.ptr = "enumField";
  DynamicStruct::Builder::get((Builder *)&typed,&root,name);
  TVar1 = DynamicValue::Builder::AsImpl<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>::
          apply((Builder *)&typed);
  DynamicValue::Builder::~Builder((Builder *)&typed);
  if ((TVar1 != BAZ) && (kj::_::Debug::minSeverity < 3)) {
    list.schema.elementType.baseType = INT8;
    name_00.content.size_ = 10;
    name_00.content.ptr = "enumField";
    DynamicStruct::Builder::get((Builder *)&typed,&root,name_00);
    TVar1 = DynamicValue::Builder::AsImpl<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>
            ::apply((Builder *)&typed);
    f_1.exception._0_2_ = TVar1;
    kj::_::Debug::
    log<char_const(&)[75],capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(TestEnum::BAZ) == (root.get(\\\"enumField\\\").as<TestEnum>())\", TestEnum::BAZ, root.get(\"enumField\").as<TestEnum>()"
               ,(char (*) [75])
                "failed: expected (TestEnum::BAZ) == (root.get(\"enumField\").as<TestEnum>())",
               (TestEnum_9c8e9318b29d9cd3 *)&list,(TestEnum_9c8e9318b29d9cd3 *)&f_1);
    DynamicValue::Builder::~Builder((Builder *)&typed);
  }
  name_01.content.size_ = 9;
  name_01.content.ptr = "enumList";
  DynamicStruct::Builder::get(&local_160,&root,name_01);
  local_26c[0] = BAR;
  local_26c[1] = FOO;
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&list,&local_160);
  if (list.builder.elementCount != 2) {
    f_1.exception = (Exception *)0x2;
    local_268 = CONCAT44(local_268._4_4_,list.builder.elementCount);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
              ((Fault *)&typed,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x23,FAILED,"(expected.size()) == (list.size())","expected.size(), list.size()",
               (unsigned_long *)&f_1,(uint *)&local_268);
    kj::_::Debug::Fault::fatal((Fault *)&typed);
  }
  pTVar3 = local_26c;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    TVar1 = *pTVar3;
    DynamicList::Builder::operator[]((Builder *)&typed,&list,(uint)lVar4);
    TVar2 = DynamicValue::Builder::AsImpl<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>
            ::apply((Builder *)&typed);
    DynamicValue::Builder::~Builder((Builder *)&typed);
    if ((TVar1 != TVar2) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&typed,&list,(uint)lVar4);
      TVar1 = DynamicValue::Builder::
              AsImpl<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>::apply
                        ((Builder *)&typed);
      f_1.exception._0_2_ = TVar1;
      kj::_::Debug::
      log<char_const(&)[75],capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x25,ERROR,
                 "\"failed: expected \" \"(expected.begin()[i]) == (list[i].template as<Element>())\", expected.begin()[i], list[i].template as<Element>()"
                 ,(char (*) [75])
                  "failed: expected (expected.begin()[i]) == (list[i].template as<Element>())",
                 pTVar3,(TestEnum_9c8e9318b29d9cd3 *)&f_1);
      DynamicValue::Builder::~Builder((Builder *)&typed);
    }
    pTVar3 = pTVar3 + 1;
  }
  DynamicValue::Builder::
  AsImpl<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_(capnp::Kind)6>::
  apply(&typed,&local_160);
  if (typed.builder.elementCount == 2) {
    pTVar3 = local_26c;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      TVar1 = *(TestEnum_9c8e9318b29d9cd3 *)
               (CONCAT62(typed.builder.ptr._2_6_,typed.builder.ptr._0_2_) +
               (ulong)(typed.builder.step * (int)lVar4 >> 3));
      if ((*pTVar3 != TVar1) && (kj::_::Debug::minSeverity < 3)) {
        f_1.exception._0_2_ = TVar1;
        kj::_::Debug::
        log<char_const(&)[53],capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x2b,ERROR,
                   "\"failed: expected \" \"(expected.begin()[i]) == (typed[i])\", expected.begin()[i], typed[i]"
                   ,(char (*) [53])"failed: expected (expected.begin()[i]) == (typed[i])",pTVar3,
                   (TestEnum_9c8e9318b29d9cd3 *)&f_1);
      }
      pTVar3 = pTVar3 + 1;
    }
    DynamicValue::Builder::~Builder(&local_160);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_268 = 2;
  local_25c = typed.builder.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f_1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x29,FAILED,"(expected.size()) == (typed.size())","expected.size(), typed.size()",
             &local_268,&local_25c);
  kj::_::Debug::Fault::fatal(&f_1);
}

Assistant:

TEST(DynamicApi, SetEnumFromNative) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  root.set("enumField", TestEnum::BAZ);
  root.set("enumList", {TestEnum::BAR, TestEnum::FOO});
  EXPECT_EQ(TestEnum::BAZ, root.get("enumField").as<TestEnum>());
  checkList<TestEnum>(root.get("enumList"), {TestEnum::BAR, TestEnum::FOO});
}